

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_init_write(qpdf_data qpdf,char *filename)

{
  char *qpdf_00;
  QPDF_ERROR_CODE n;
  _func_void__qpdf_data_ptr *local_48;
  function<void_(_qpdf_data_*)> local_40;
  QPDF_ERROR_CODE local_1c;
  char *pcStack_18;
  QPDF_ERROR_CODE status;
  char *filename_local;
  qpdf_data qpdf_local;
  
  pcStack_18 = filename;
  filename_local = (char *)qpdf;
  qpdf_init_write_internal(qpdf);
  qpdf_00 = filename_local;
  *(char **)(filename_local + 0x78) = pcStack_18;
  local_48 = call_init_write;
  std::function<void(_qpdf_data*)>::function<void(*)(_qpdf_data*),void>
            ((function<void(_qpdf_data*)> *)&local_40,&local_48);
  n = trap_errors((qpdf_data)qpdf_00,&local_40);
  std::function<void_(_qpdf_data_*)>::~function(&local_40);
  local_1c = n;
  QTC::TC("qpdf","qpdf-c called qpdf_init_write",n);
  return local_1c;
}

Assistant:

QPDF_ERROR_CODE
qpdf_init_write(qpdf_data qpdf, char const* filename)
{
    qpdf_init_write_internal(qpdf);
    qpdf->filename = filename;
    QPDF_ERROR_CODE status = trap_errors(qpdf, &call_init_write);
    QTC::TC("qpdf", "qpdf-c called qpdf_init_write", status);
    return status;
}